

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O2

QVector<int> * __thiscall
InsertProxyModelPrivate::setDataInContainer
          (QVector<int> *__return_storage_ptr__,InsertProxyModelPrivate *this,
          RolesContainer *baseHash,int role,QVariant *value)

{
  bool bVar1;
  iterator it;
  iterator iVar2;
  int *key;
  QVector<int> adjRoles;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  adjRoles.d.d = (Data *)0x0;
  adjRoles.d.ptr = (int *)0x0;
  adjRoles.d.size = 0;
  QList<int>::reserve(&adjRoles,2);
  QList<int>::reserve(__return_storage_ptr__,2);
  QList<int>::append(&adjRoles,role);
  key = adjRoles.d.ptr;
  if ((this->m_separateEditDisplay == false) && ((role & 0xfffffffdU) == 0)) {
    QList<int>::append(&adjRoles,(uint)(role == 0) * 2);
    key = adjRoles.d.ptr;
  }
  do {
    if (key == adjRoles.d.ptr + adjRoles.d.size) {
      QArrayDataPointer<int>::~QArrayDataPointer(&adjRoles.d);
      return __return_storage_ptr__;
    }
    it = QMap<int,_QVariant>::find(baseHash,key);
    iVar2._M_node = (_Base_ptr)QMap<int,_QVariant>::end(baseHash);
    if (it.i._M_node == (iterator)iVar2._M_node) {
      bVar1 = ::QVariant::isValid(value);
      if (bVar1) {
        QMap<int,_QVariant>::insert(baseHash,key,value);
        goto LAB_0013e318;
      }
    }
    else {
      bVar1 = ::QVariant::isValid(value);
      if (bVar1) {
        bVar1 = operator!=((QVariant *)((long)it.i._M_node + 0x28),value);
        if (!bVar1) goto LAB_0013e324;
        ::QVariant::operator=((QVariant *)((long)it.i._M_node + 0x28),value);
      }
      else {
        QMap<int,_QVariant>::erase(baseHash,(const_iterator)it.i._M_node);
      }
LAB_0013e318:
      QList<int>::append(__return_storage_ptr__,*key);
    }
LAB_0013e324:
    key = key + 1;
  } while( true );
}

Assistant:

QVector<int> InsertProxyModelPrivate::setDataInContainer(RolesContainer &baseHash, int role, const QVariant &value)
{
    QVector<int> changedRoles;
    QVector<int> adjRoles;
    adjRoles.reserve(2);
    changedRoles.reserve(2);
    adjRoles.append(role);
    if ((!m_separateEditDisplay) && (role == Qt::DisplayRole || role == Qt::EditRole))
        adjRoles.append(role == Qt::DisplayRole ? Qt::EditRole : Qt::DisplayRole);
    for (auto adjRole = adjRoles.cbegin(); adjRole != adjRoles.cend(); ++adjRole) {
        const auto dataIter = baseHash.find(*adjRole);
        if (dataIter == baseHash.end()) {
            if (!value.isValid())
                continue;
            baseHash.insert(*adjRole, value);
            changedRoles.append(*adjRole);
        } else {
            Q_ASSERT(dataIter.value().isValid());
            if (!value.isValid()) {
                baseHash.erase(dataIter);
                changedRoles.append(*adjRole);
            } else {
                if (dataIter.value() != value) {
                    dataIter.value() = value;
                    changedRoles.append(*adjRole);
                }
            }
        }
    }
    return changedRoles;
}